

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::BxDFHandle::rho
          (BxDFHandle *this,span<const_pbrt::Point2<float>_> u1,span<const_float> uc,
          span<const_pbrt::Point2<float>_> u2)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_XMM5 [16];
  SampledSpectrum SVar10;
  DispatchSplit<5> local_e9;
  TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
  local_e8;
  float local_dc;
  float local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  float local_cc;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  Tuple2<pbrt::Point2,_float> local_b8;
  undefined8 local_b0;
  float local_a8;
  undefined8 *local_a0;
  float *pfStack_98;
  Tuple2<pbrt::Point2,_float> *pTStack_90;
  undefined4 *puStack_88;
  undefined4 *local_80;
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined4 local_50;
  float local_4c;
  char local_3c;
  
  sVar2 = uc.n;
  if (sVar2 == 0) {
    _local_c8 = ZEXT816(0);
  }
  else {
    sVar3 = 0;
    _local_c8 = ZEXT816(0);
    do {
      local_78 = ZEXT416((uint)u1.ptr[sVar3].super_Tuple2<pbrt::Point2,_float>.x);
      local_d8 = u1.ptr[sVar3].super_Tuple2<pbrt::Point2,_float>.y * 6.2831855;
      local_dc = cosf(local_d8);
      fVar5 = sinf(local_d8);
      if (((float)local_78._0_4_ != 0.0) || (NAN((float)local_78._0_4_))) {
        local_a0 = &local_b0;
        local_b8 = u2.ptr[sVar3].super_Tuple2<pbrt::Point2,_float>;
        auVar1 = vmaxss_avx(ZEXT416((uint)(1.0 - (float)local_78._0_4_ * (float)local_78._0_4_)),
                            ZEXT816(0) << 0x40);
        auVar1 = vsqrtss_avx(auVar1,auVar1);
        local_cc = uc.ptr[sVar3];
        pfStack_98 = &local_cc;
        local_d0 = 0;
        local_d4 = 3;
        pTStack_90 = &local_b8;
        puStack_88 = &local_d0;
        auVar1 = vinsertps_avx(ZEXT416((uint)(auVar1._0_4_ * local_dc)),
                               ZEXT416((uint)(fVar5 * auVar1._0_4_)),0x10);
        local_80 = &local_d4;
        local_b0 = vmovlps_avx(auVar1);
        local_a8 = (float)local_78._0_4_;
        local_e8.bits =
             (this->
             super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
             ).bits;
        if ((uint)(local_e8.bits >> 0x31) < 3) {
          DispatchSplit<5>::operator()(&local_68,&local_e9,&local_e8);
        }
        else {
          DispatchSplit<5>::operator()
                    (&local_68,&local_e9,&local_e8,(ushort)(local_e8.bits >> 0x30) - 5);
        }
        if (local_3c == '\x01') {
          auVar9._8_4_ = 0x7fffffff;
          auVar9._0_8_ = 0x7fffffff7fffffff;
          auVar9._12_4_ = 0x7fffffff;
          auVar8._0_4_ = local_78._0_4_;
          auVar8._4_4_ = auVar8._0_4_;
          auVar8._8_4_ = auVar8._0_4_;
          auVar8._12_4_ = auVar8._0_4_;
          auVar1._4_4_ = local_50;
          auVar1._0_4_ = local_50;
          auVar1._8_4_ = local_50;
          auVar1._12_4_ = local_50;
          auVar4 = vandps_avx512vl(auVar9,auVar1);
          auVar1 = vandps_avx(auVar8,auVar9);
          auVar6._0_4_ = auVar1._0_4_ * auVar4._0_4_ * local_68;
          auVar6._4_4_ = auVar1._4_4_ * auVar4._4_4_ * fStack_64;
          auVar6._8_4_ = auVar1._8_4_ * auVar4._8_4_ * fStack_60;
          auVar6._12_4_ = auVar1._12_4_ * auVar4._12_4_ * fStack_5c;
          fVar5 = local_4c * 0.15915494;
          auVar4._4_4_ = fVar5;
          auVar4._0_4_ = fVar5;
          auVar4._8_4_ = fVar5;
          auVar4._12_4_ = fVar5;
          auVar1 = vdivps_avx(auVar6,auVar4);
          local_c8._0_4_ = auVar1._0_4_ + (float)local_c8._0_4_;
          local_c8._4_4_ = auVar1._4_4_ + (float)local_c8._4_4_;
          fStack_c0 = auVar1._8_4_ + fStack_c0;
          fStack_bc = auVar1._12_4_ + fStack_bc;
        }
      }
      sVar3 = sVar3 + 1;
    } while (sVar2 != sVar3);
  }
  auVar1 = vcvtusi2ss_avx512f(in_XMM5,sVar2);
  fVar5 = auVar1._0_4_ * 3.1415927;
  auVar7._4_4_ = fVar5;
  auVar7._0_4_ = fVar5;
  auVar7._8_4_ = fVar5;
  auVar7._12_4_ = fVar5;
  auVar1 = vdivps_avx(_local_c8,auVar7);
  auVar4 = vshufpd_avx(auVar1,auVar1,1);
  SVar10.values.values._0_8_ = auVar1._0_8_;
  SVar10.values.values._8_8_ = auVar4._0_8_;
  return (SampledSpectrum)SVar10.values.values;
}

Assistant:

SampledSpectrum BxDFHandle::rho(pstd::span<const Point2f> u1, pstd::span<const Float> uc,
                                pstd::span<const Point2f> u2) const {
    DCHECK_EQ(uc.size(), u1.size());
    DCHECK_EQ(u1.size(), u2.size());
    SampledSpectrum r(0.f);
    for (size_t i = 0; i < uc.size(); ++i) {
        // Compute estimate of of $\rho_\roman{hh}$
        Vector3f wo = SampleUniformHemisphere(u1[i]);
        if (wo.z == 0)
            continue;
        Float pdfo = UniformHemispherePDF();
        pstd::optional<BSDFSample> bs = Sample_f(wo, uc[i], u2[i]);
        if (bs)
            r += bs->f * AbsCosTheta(bs->wi) * AbsCosTheta(wo) / (pdfo * bs->pdf);
    }
    return r / (Pi * uc.size());
}